

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O0

int yy_next_stmt(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int yythunkpos0;
  int yypos0;
  GREG *G_local;
  
  iVar1 = G->pos;
  iVar2 = G->thunkpos;
  iVar3 = yymatchString(G,"next");
  if (iVar3 != 0) {
    yyDo(G,yy_1_next_stmt,G->begin,G->end,"yy_1_next_stmt");
  }
  else {
    G->pos = iVar1;
    G->thunkpos = iVar2;
  }
  G_local._4_4_ = (uint)(iVar3 != 0);
  return G_local._4_4_;
}

Assistant:

YY_RULE(int) yy_next_stmt(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyprintfv((stderr, "%s\n", "next_stmt"));
  if (!yymatchString(G, "next")) goto l833;
  yyDo(G, yy_1_next_stmt, G->begin, G->end, "yy_1_next_stmt");
  yyprintf((stderr, "  ok   next_stmt"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));

  return 1;
  l833:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "next_stmt"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}